

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RndFun.cpp
# Opt level: O2

void Theta(Sarray *A,Sarray *B,vector<unsigned_long,_std::allocator<unsigned_long>_> *C,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *D)

{
  pointer pvVar1;
  pointer puVar2;
  ulong *puVar3;
  pointer puVar4;
  long lVar5;
  long lVar6;
  pointer pvVar7;
  int y;
  ulong uVar8;
  long lVar9;
  long lVar10;
  
  pvVar1 = (A->
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (C->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pvVar7 = pvVar1;
  for (lVar6 = 0; lVar6 != 5; lVar6 = lVar6 + 1) {
    puVar3 = (pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar2[lVar6] = puVar3[3] ^ puVar3[1] ^ puVar3[2] ^ *puVar3 ^ puVar3[4];
    pvVar7 = pvVar7 + 1;
  }
  puVar4 = (D->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = 0;
  while (lVar6 != 5) {
    uVar8 = (ulong)((int)lVar6 - 1);
    if (lVar6 == 0) {
      uVar8 = 4;
    }
    lVar10 = 0;
    if (lVar6 != 4) {
      lVar10 = lVar6 + 1;
    }
    puVar4[lVar6] = (puVar2[lVar10] << 1 | (ulong)((long)puVar2[lVar10] < 0)) ^ puVar2[uVar8];
    lVar6 = lVar6 + 1;
  }
  pvVar7 = (B->
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  for (lVar6 = 0; lVar6 != 5; lVar6 = lVar6 + 1) {
    lVar10 = *(long *)&pvVar1[lVar6].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
    lVar5 = *(long *)&pvVar7[lVar6].
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data;
    for (lVar9 = 0; lVar9 != 5; lVar9 = lVar9 + 1) {
      *(unsigned_long *)(lVar5 + lVar9 * 8) = puVar4[lVar6] ^ *(ulong *)(lVar10 + lVar9 * 8);
    }
  }
  return;
}

Assistant:

void Theta(Sarray &A, Sarray &B, vector<uint64_t> &C, vector<uint64_t> &D){
    for(int x=0;x<5;x++){
        C[x] = A[x][0]^A[x][1]^A[x][2]^A[x][3]^A[x][4];
    }

    for(int x=0;x<5;x++){
        D[x] = (C[(x+4)%5])^(rot(C[(x+1)%5],1));
    }

    for(int x=0;x<5;x++){
        for(int y=0;y<5;y++){
            B[x][y] = A[x][y] ^ D[x];
        }
    }
}